

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbifnet.cpp
# Opt level: O0

void __thiscall
HttpReqThread::post_result(HttpReqThread *this,int status,CVmDataSource *reply,char *hdrs,char *loc)

{
  CVmDataSource *reply_00;
  TadsMessageQueue *in_RDI;
  TadsHttpReqResult *evt;
  TadsMessage *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffc4;
  vm_globalvar_t *in_stack_ffffffffffffffc8;
  TadsHttpReqResult *in_stack_ffffffffffffffd0;
  
  reply_00 = (CVmDataSource *)operator_new(0x68);
  TadsHttpReqResult::TadsHttpReqResult
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,reply_00,
             (char *)in_RDI,(char *)in_stack_ffffffffffffffa8);
  TadsMessageQueue::post(in_RDI,in_stack_ffffffffffffffa8);
  in_RDI[2].ev = (OS_Event *)0x0;
  return;
}

Assistant:

void post_result(int status, CVmDataSource *reply, char *hdrs, char *loc)
    {
        /* establish the global context */
        VMGLOB_PTR(vmg);

        /* create the result event */
        TadsHttpReqResult *evt = new TadsHttpReqResult(
            vmg_ idg, status, reply, hdrs, loc);

        /* post the event (this transfers ownership to the queue) */
        queue->post(evt);

        /* the result event now owns our ID global 'idg', so forget it */
        idg = 0;
    }